

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O1

int flvtag_amfcaption_utf8(flvtag_t *tag,uint32_t timestamp,utf8_char_t *text)

{
  ulong __size;
  uint8_t *puVar1;
  size_t sVar2;
  uint8_t *puVar3;
  size_t sVar4;
  size_t __n;
  
  flvtag_initamf(tag,timestamp);
  sVar2 = strlen(text);
  __n = 0x10064;
  if (sVar2 < 0x10064) {
    __n = sVar2;
  }
  __size = __n + 0x3d;
  if (tag->aloc < __size) {
    puVar3 = (uint8_t *)realloc(tag->data,__size);
    tag->data = puVar3;
    tag->aloc = __size;
  }
  sVar4 = flvtag_header_size(tag);
  puVar1 = tag->data;
  puVar3 = puVar1 + sVar4;
  puVar3[0] = '\x02';
  puVar3[1] = '\0';
  puVar3[2] = '\r';
  puVar3[3] = 'o';
  puVar3[4] = 'n';
  puVar3[5] = 'C';
  puVar3[6] = 'a';
  puVar3[7] = 'p';
  puVar3[8] = 't';
  puVar3[9] = 'i';
  puVar3[10] = 'o';
  puVar3[0xb] = 'n';
  puVar3[0xc] = 'I';
  puVar3[0xd] = 'n';
  puVar3[0xe] = 'f';
  puVar3[0xf] = 'o';
  puVar3 = puVar1 + sVar4 + 0x10;
  puVar3[0] = '\b';
  puVar3[1] = '\0';
  puVar3[2] = '\0';
  puVar3[3] = '\0';
  puVar3[4] = '\x02';
  puVar3[5] = '\0';
  puVar3[6] = '\x04';
  puVar3[7] = 't';
  puVar3[8] = 'y';
  puVar3[9] = 'p';
  puVar3[10] = 'e';
  puVar3[0xb] = '\x02';
  puVar3[0xc] = '\0';
  puVar3[0xd] = '\x04';
  puVar3[0xe] = 'U';
  puVar3[0xf] = 'T';
  puVar1 = puVar1 + sVar4 + 0x1b;
  puVar1[0] = '\x02';
  puVar1[1] = '\0';
  puVar1[2] = '\x04';
  puVar1[3] = 'U';
  puVar1[4] = 'T';
  puVar1[5] = 'F';
  puVar1[6] = '8';
  puVar1[7] = '\0';
  puVar1[8] = '\x04';
  puVar1[9] = 'd';
  puVar1[10] = 'a';
  puVar1[0xb] = 't';
  puVar1[0xc] = 'a';
  puVar1[0xd] = '\x02';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  sVar4 = flvtag_header_size(tag);
  puVar3 = tag->data;
  memcpy(puVar3 + sVar4 + 0x2a,text,__n);
  *(ushort *)(puVar3 + sVar4 + 0x28) = (ushort)__n << 8 | (ushort)__n >> 8;
  (puVar3 + __n + 0x2a + sVar4)[0] = '\0';
  (puVar3 + __n + 0x2a + sVar4)[1] = '\0';
  puVar3[__n + 0x2c + sVar4] = '\t';
  flvtag_updatesize(tag,(int)__n + 0x2e);
  return 1;
}

Assistant:

int flvtag_amfcaption_utf8(flvtag_t* tag, uint32_t timestamp, const utf8_char_t* text)
{
    flvtag_initamf(tag, timestamp);
    unsigned long size = strlen(text);

    if (MAX_AMF_STRING < size) {
        size = MAX_AMF_STRING;
    }

    flvtag_reserve(tag, sizeof(onCaptionInfoUTF8) + size + 3);
    memcpy(flvtag_payload_data(tag), onCaptionInfoUTF8, sizeof(onCaptionInfoUTF8));
    uint8_t* data = flvtag_payload_data(tag) + sizeof(onCaptionInfo708);
    memcpy(data, text, size);
    // Update the size of the string
    data[-2] = size >> 8;
    data[-1] = size >> 0;
    // write the last array element
    data[size + 0] = 0x00;
    data[size + 1] = 0x00;
    data[size + 2] = 0x09;
    flvtag_updatesize(tag, sizeof(onCaptionInfoUTF8) + size + 3);

    return 1;
}